

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.h
# Opt level: O0

void __thiscall wallet::SQLiteBatch::~SQLiteBatch(SQLiteBatch *this)

{
  DatabaseBatch *in_RDI;
  long in_FS_OFFSET;
  unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_> *this_00;
  
  this_00 = *(unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>
              **)(in_FS_OFFSET + 0x28);
  in_RDI->_vptr_DatabaseBatch = (_func_int **)&PTR_ReadKey_00cb27b0;
  (*in_RDI->_vptr_DatabaseBatch[7])();
  std::unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_>::
  ~unique_ptr(this_00);
  DatabaseBatch::~DatabaseBatch(in_RDI);
  if (*(unique_ptr<wallet::SQliteExecHandler,_std::default_delete<wallet::SQliteExecHandler>_> **)
       (in_FS_OFFSET + 0x28) == this_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~SQLiteBatch() override { Close(); }